

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

double flatbuffers::GetAnyValueF(BaseType type,uint8_t *data)

{
  int64_t iVar1;
  uint8_t *__nptr;
  double dVar2;
  double dVar3;
  char *end;
  uint8_t *local_18;
  
  if (type == String) {
    __nptr = data + (ulong)*(uint *)data + 4;
    local_18 = __nptr;
    dVar2 = strtod_l((char *)__nptr,(char **)&local_18,ClassicLocale::instance_);
    dVar3 = 0.0;
    if (((local_18 != __nptr) && (*local_18 == '\0')) && (dVar3 = dVar2, NAN(dVar2))) {
      dVar3 = NAN;
    }
  }
  else if (type == Double) {
    dVar3 = *(double *)data;
  }
  else if (type == Float) {
    dVar3 = (double)*(float *)data;
  }
  else {
    iVar1 = GetAnyValueI(type,data);
    dVar3 = (double)iVar1;
  }
  return dVar3;
}

Assistant:

double GetAnyValueF(reflection::BaseType type, const uint8_t *data) {
  switch (type) {
    case reflection::Float: return static_cast<double>(ReadScalar<float>(data));
    case reflection::Double: return ReadScalar<double>(data);
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      if (s) {
        double d;
        StringToNumber(s->c_str(), &d);
        return d;
      } else {
        return 0.0;
      }
    }
    default: return static_cast<double>(GetAnyValueI(type, data));
  }
}